

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

void QSettings::setPath(Format format,Scope scope,QString *path)

{
  QHash<int,_(anonymous_namespace)::Path> *this;
  unique_lock<QBasicMutex> *this_00;
  long in_FS_OFFSET;
  QString local_a8;
  int local_8c;
  QStringBuilder<const_QString_&,_QChar> local_88;
  Path local_78;
  unique_lock<QBasicMutex> local_58;
  unique_lock<QBasicMutex> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_48;
  local_48._M_device = &settingsGlobalMutex;
  local_48._M_owns = false;
  local_48._9_7_ = 0xaaaaaaaaaaaaaa;
  std::unique_lock<QBasicMutex>::lock(this_00);
  local_48._M_owns = true;
  this = (QHash<int,_(anonymous_namespace)::Path> *)
         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pathHashFunc>_>::
         operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pathHashFunc>_>
                     *)this_00);
  if ((*(long *)this == 0) || (*(long *)(*(long *)this + 8) == 0)) {
    local_58._M_device = local_48._M_device;
    local_58._M_owns = local_48._M_owns;
    local_48._M_device = (QBasicMutex *)0x0;
    local_48._M_owns = false;
    initDefaultPaths((unique_lock<QBasicMutex> *)&local_78);
    std::unique_lock<QBasicMutex>::operator=(&local_48,(unique_lock<QBasicMutex> *)&local_78);
    std::unique_lock<QBasicMutex>::~unique_lock((unique_lock<QBasicMutex> *)&local_78);
    std::unique_lock<QBasicMutex>::~unique_lock(&local_58);
  }
  local_8c = (uint)(scope == SystemScope) + format * 2;
  local_88.b.ucs = L'/';
  local_88.a = path;
  QStringBuilder<const_QString_&,_QChar>::convertTo<QString>(&local_a8,&local_88);
  local_78.path.d.d = local_a8.d.d;
  local_78.path.d.ptr = local_a8.d.ptr;
  local_78.path.d.size = local_a8.d.size;
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78.userDefined = true;
  QHash<int,_(anonymous_namespace)::Path>::insert(this,&local_8c,&local_78);
  if (&(local_78.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.path.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  std::unique_lock<QBasicMutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSettings::setPath(Format format, Scope scope, const QString &path)
{
    auto locker = qt_unique_lock(settingsGlobalMutex);
    PathHash *pathHash = pathHashFunc();
    if (pathHash->isEmpty())
        locker = initDefaultPaths(std::move(locker));
    pathHash->insert(pathHashKey(format, scope), Path(path + QDir::separator(), true));
}